

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.hpp
# Opt level: O0

void __thiscall CorUnix::CSimpleHandleManager::CSimpleHandleManager(CSimpleHandleManager *this)

{
  CSimpleHandleManager *this_local;
  
  this->_vptr_CSimpleHandleManager = (_func_int **)&PTR__CSimpleHandleManager_001d2508;
  this->m_hiFreeListStart = 0xffffffffffffffff;
  this->m_hiFreeListEnd = 0xffffffffffffffff;
  this->m_dwTableSize = 0;
  this->m_dwTableGrowthRate = 0x400;
  this->m_rghteHandleTable = (HANDLE_TABLE_ENTRY *)0x0;
  this->m_fLockInitialized = false;
  return;
}

Assistant:

CSimpleHandleManager()
            :
            m_hiFreeListStart(c_hiInvalid),
            m_hiFreeListEnd(c_hiInvalid),
            m_dwTableSize(0),
            m_dwTableGrowthRate(c_BasicGrowthRate),
            m_rghteHandleTable(NULL),
            m_fLockInitialized(FALSE)
        {
        }